

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O1

float indk::Position::getDistance(Position *L,Position *R)

{
  uint uVar1;
  uint uVar2;
  Error *this;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  uVar1 = L->DimensionsCount;
  uVar2 = R->DimensionsCount;
  if (uVar1 != uVar2) {
    this = (Error *)__cxa_allocate_exception(0x28);
    Error::Error(this,10);
    __cxa_throw(this,&Error::typeinfo,Error::~Error);
  }
  fVar4 = 0.0;
  if ((ulong)uVar1 != 0) {
    uVar3 = 0;
    do {
      fVar5 = -1.0;
      if (uVar3 < uVar2) {
        fVar5 = R->X[uVar3];
      }
      fVar6 = -1.0;
      if (uVar3 < uVar2) {
        fVar6 = R->X[uVar3];
      }
      fVar4 = fVar4 + (L->X[uVar3] - fVar6) * (L->X[uVar3] - fVar5);
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  if (0.0 <= fVar4) {
    return SQRT(fVar4);
  }
  fVar4 = sqrtf(fVar4);
  return fVar4;
}

Assistant:

unsigned int indk::Position::getDimensionsCount() const {
    return DimensionsCount;
}